

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O0

bool __thiscall
re2::Regexp::Walker<bool>::WalkInternal(Walker<bool> *this,Regexp *re,bool top_arg,bool use_copy)

{
  stack<re2::WalkState<bool>,_std::deque<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>_>
  *psVar1;
  int iVar2;
  ostream *poVar3;
  bool *pbVar4;
  size_type sVar5;
  WalkState<bool> local_210;
  Regexp **local_1f8;
  Regexp **sub;
  Regexp *pRStack_1e8;
  bool stop;
  Regexp *re_1;
  reference pvStack_1d8;
  bool t;
  WalkState<bool> *s;
  LogMessage local_1a8;
  byte local_22;
  byte local_21;
  bool use_copy_local;
  Regexp *pRStack_20;
  bool top_arg_local;
  Regexp *re_local;
  Walker<bool> *this_local;
  
  local_22 = use_copy;
  local_21 = top_arg;
  pRStack_20 = re;
  re_local = (Regexp *)this;
  Reset(this);
  if (pRStack_20 == (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/walker-inl.h",
               0xa0);
    poVar3 = LogMessage::stream(&local_1a8);
    std::operator<<(poVar3,"Walk NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a8);
    re_1._7_1_ = local_21;
LAB_0016eb0d:
    this_local._7_1_ = (bool)(re_1._7_1_ & 1);
    return this_local._7_1_;
  }
  psVar1 = this->stack_;
  WalkState<bool>::WalkState((WalkState<bool> *)&s,pRStack_20,(bool)(local_21 & 1));
  std::
  stack<re2::WalkState<bool>,_std::deque<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>_>
  ::push(psVar1,(value_type *)&s);
LAB_0016e72e:
  do {
    pvStack_1d8 = std::
                  stack<re2::WalkState<bool>,_std::deque<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>_>
                  ::top(this->stack_);
    pRStack_1e8 = pvStack_1d8->re;
    if (pvStack_1d8->n == -1) {
      iVar2 = this->max_visits_ + -1;
      this->max_visits_ = iVar2;
      if (iVar2 < 0) {
        this->stopped_early_ = true;
        iVar2 = (*this->_vptr_Walker[5])(this,pRStack_1e8,(ulong)pvStack_1d8->parent_arg & 1);
        re_1._7_1_ = (byte)iVar2 & 1;
      }
      else {
        sub._7_1_ = 0;
        iVar2 = (*this->_vptr_Walker[2])
                          (this,pRStack_1e8,(ulong)(pvStack_1d8->parent_arg & 1),(long)&sub + 7);
        pvStack_1d8->pre_arg = (bool)((byte)iVar2 & 1);
        if ((sub._7_1_ & 1) == 0) {
          pvStack_1d8->n = 0;
          pvStack_1d8->child_args = (bool *)0x0;
          if (pRStack_1e8->nsub_ == 1) {
            pvStack_1d8->child_args = &pvStack_1d8->child_arg;
          }
          else if (1 < pRStack_1e8->nsub_) {
            pbVar4 = (bool *)operator_new__((ulong)pRStack_1e8->nsub_);
            pvStack_1d8->child_args = pbVar4;
          }
          goto LAB_0016e88f;
        }
        re_1._7_1_ = pvStack_1d8->pre_arg & 1;
      }
    }
    else {
LAB_0016e88f:
      if ((pRStack_1e8->nsub_ != 0) &&
         (local_1f8 = Regexp::sub(pRStack_1e8), pvStack_1d8->n < (int)(uint)pRStack_1e8->nsub_)) {
        if ((((local_22 & 1) == 0) || (pvStack_1d8->n < 1)) ||
           (local_1f8[pvStack_1d8->n + -1] != local_1f8[pvStack_1d8->n])) {
          psVar1 = this->stack_;
          WalkState<bool>::WalkState
                    (&local_210,local_1f8[pvStack_1d8->n],(bool)(pvStack_1d8->pre_arg & 1));
          std::
          stack<re2::WalkState<bool>,_std::deque<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>_>
          ::push(psVar1,&local_210);
        }
        else {
          iVar2 = pvStack_1d8->n + -1;
          iVar2 = (*this->_vptr_Walker[4])
                            (this,(ulong)pvStack_1d8->child_args[iVar2] & 1,(long)pvStack_1d8->n,
                             CONCAT71((int7)(int3)((uint)iVar2 >> 8),pvStack_1d8->child_args[iVar2])
                             & 0xffffffffffffff01);
          pvStack_1d8->child_args[pvStack_1d8->n] = (bool)((byte)iVar2 & 1);
          pvStack_1d8->n = pvStack_1d8->n + 1;
        }
        goto LAB_0016e72e;
      }
      iVar2 = (*this->_vptr_Walker[3])
                        (this,pRStack_1e8,(ulong)(pvStack_1d8->parent_arg & 1),
                         (ulong)(pvStack_1d8->pre_arg & 1),pvStack_1d8->child_args,
                         (ulong)(uint)pvStack_1d8->n);
      re_1._7_1_ = (byte)iVar2 & 1;
      if ((1 < pRStack_1e8->nsub_) && (pvStack_1d8->child_args != (bool *)0x0)) {
        operator_delete__(pvStack_1d8->child_args);
      }
    }
    std::
    stack<re2::WalkState<bool>,_std::deque<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>_>
    ::pop(this->stack_);
    sVar5 = std::
            stack<re2::WalkState<bool>,_std::deque<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>_>
            ::size(this->stack_);
    if (sVar5 == 0) goto LAB_0016eb0d;
    pvStack_1d8 = std::
                  stack<re2::WalkState<bool>,_std::deque<re2::WalkState<bool>,_std::allocator<re2::WalkState<bool>_>_>_>
                  ::top(this->stack_);
    if (pvStack_1d8->child_args == (bool *)0x0) {
      pvStack_1d8->child_arg = (bool)(re_1._7_1_ & 1);
    }
    else {
      pvStack_1d8->child_args[pvStack_1d8->n] = (bool)(re_1._7_1_ & 1);
    }
    pvStack_1d8->n = pvStack_1d8->n + 1;
  } while( true );
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_->push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_->top();
    Regexp* re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        // Fall through.
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_->push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_->top().
    // Update next guy down.
    stack_->pop();
    if (stack_->size() == 0)
      return t;
    s = &stack_->top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}